

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::protobuf_google_2fprotobuf_2fdescriptor_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0042ef20 == '\x01') {
    DAT_0042ef20 = '\0';
    (*(code *)*_FileDescriptorSet_default_instance_)();
  }
  if (DAT_0042f8b8 != (long *)0x0) {
    (**(code **)(*DAT_0042f8b8 + 8))();
  }
  if (DAT_0042f000 == '\x01') {
    DAT_0042f000 = '\0';
    (*(code *)*_FileDescriptorProto_default_instance_)();
  }
  if (DAT_0042f8c8 != (long *)0x0) {
    (**(code **)(*DAT_0042f8c8 + 8))();
  }
  if (DAT_0042f028 == '\x01') {
    DAT_0042f028 = '\0';
    (*(code *)*_DescriptorProto_ExtensionRange_default_instance_)();
  }
  if (DAT_0042f8d8 != (long *)0x0) {
    (**(code **)(*DAT_0042f8d8 + 8))();
  }
  if (DAT_0042f050 == '\x01') {
    DAT_0042f050 = '\0';
    (*(code *)*_DescriptorProto_ReservedRange_default_instance_)();
  }
  if (DAT_0042f8e8 != (long *)0x0) {
    (**(code **)(*DAT_0042f8e8 + 8))();
  }
  if (DAT_0042f140 == '\x01') {
    DAT_0042f140 = '\0';
    (*(code *)*_DescriptorProto_default_instance_)();
  }
  if (DAT_0042f8f8 != (long *)0x0) {
    (**(code **)(*DAT_0042f8f8 + 8))();
  }
  if (DAT_0042f1a0 == '\x01') {
    DAT_0042f1a0 = '\0';
    (*(code *)*_FieldDescriptorProto_default_instance_)();
  }
  if (DAT_0042f908 != (long *)0x0) {
    (**(code **)(*DAT_0042f908 + 8))();
  }
  if (DAT_0042f1d0 == '\x01') {
    DAT_0042f1d0 = '\0';
    (*(code *)*_OneofDescriptorProto_default_instance_)();
  }
  if (DAT_0042f918 != (long *)0x0) {
    (**(code **)(*DAT_0042f918 + 8))();
  }
  if (DAT_0042f218 == '\x01') {
    DAT_0042f218 = '\0';
    (*(code *)*_EnumDescriptorProto_default_instance_)();
  }
  if (DAT_0042f928 != (long *)0x0) {
    (**(code **)(*DAT_0042f928 + 8))();
  }
  if (DAT_0042f250 == '\x01') {
    DAT_0042f250 = '\0';
    (*(code *)*_EnumValueDescriptorProto_default_instance_)();
  }
  if (DAT_0042f938 != (long *)0x0) {
    (**(code **)(*DAT_0042f938 + 8))();
  }
  if (DAT_0042f298 == '\x01') {
    DAT_0042f298 = '\0';
    (*(code *)*_ServiceDescriptorProto_default_instance_)();
  }
  if (DAT_0042f948 != (long *)0x0) {
    (**(code **)(*DAT_0042f948 + 8))();
  }
  if (DAT_0042f2e0 == '\x01') {
    DAT_0042f2e0 = '\0';
    (*(code *)*_MethodDescriptorProto_default_instance_)();
  }
  if (DAT_0042f958 != (long *)0x0) {
    (**(code **)(*DAT_0042f958 + 8))();
  }
  if (DAT_0042f398 == '\x01') {
    DAT_0042f398 = '\0';
    (*(code *)*_FileOptions_default_instance_)();
  }
  if (DAT_0042f968 != (long *)0x0) {
    (**(code **)(*DAT_0042f968 + 8))();
  }
  if (DAT_0042f410 == '\x01') {
    DAT_0042f410 = '\0';
    (*(code *)*_MessageOptions_default_instance_)();
  }
  if (DAT_0042f978 != (long *)0x0) {
    (**(code **)(*DAT_0042f978 + 8))();
  }
  if (DAT_0042f490 == '\x01') {
    DAT_0042f490 = '\0';
    (*(code *)*_FieldOptions_default_instance_)();
  }
  if (DAT_0042f988 != (long *)0x0) {
    (**(code **)(*DAT_0042f988 + 8))();
  }
  if (DAT_0042f500 == '\x01') {
    DAT_0042f500 = '\0';
    (*(code *)*_OneofOptions_default_instance_)();
  }
  if (DAT_0042f998 != (long *)0x0) {
    (**(code **)(*DAT_0042f998 + 8))();
  }
  if (DAT_0042f578 == '\x01') {
    DAT_0042f578 = '\0';
    (*(code *)*_EnumOptions_default_instance_)();
  }
  if (DAT_0042f9a8 != (long *)0x0) {
    (**(code **)(*DAT_0042f9a8 + 8))();
  }
  if (DAT_0042f5f0 == '\x01') {
    DAT_0042f5f0 = '\0';
    (*(code *)*_EnumValueOptions_default_instance_)();
  }
  if (DAT_0042f9b8 != (long *)0x0) {
    (**(code **)(*DAT_0042f9b8 + 8))();
  }
  if (DAT_0042f668 == '\x01') {
    DAT_0042f668 = '\0';
    (*(code *)*_ServiceOptions_default_instance_)();
  }
  if (DAT_0042f9c8 != (long *)0x0) {
    (**(code **)(*DAT_0042f9c8 + 8))();
  }
  if (DAT_0042f6e0 == '\x01') {
    DAT_0042f6e0 = '\0';
    (*(code *)*_MethodOptions_default_instance_)();
  }
  if (DAT_0042f9d8 != (long *)0x0) {
    (**(code **)(*DAT_0042f9d8 + 8))();
  }
  if (DAT_0042f710 == '\x01') {
    DAT_0042f710 = '\0';
    (*(code *)*_UninterpretedOption_NamePart_default_instance_)();
  }
  if (DAT_0042f9e8 != (long *)0x0) {
    (**(code **)(*DAT_0042f9e8 + 8))();
  }
  if (DAT_0042f778 == '\x01') {
    DAT_0042f778 = '\0';
    (*(code *)*_UninterpretedOption_default_instance_)();
  }
  if (DAT_0042f9f8 != (long *)0x0) {
    (**(code **)(*DAT_0042f9f8 + 8))();
  }
  if (DAT_0042f7f0 == '\x01') {
    DAT_0042f7f0 = '\0';
    (*(code *)*_SourceCodeInfo_Location_default_instance_)();
  }
  if (DAT_0042fa08 != (long *)0x0) {
    (**(code **)(*DAT_0042fa08 + 8))();
  }
  if (DAT_0042f828 == '\x01') {
    DAT_0042f828 = '\0';
    (*(code *)*_SourceCodeInfo_default_instance_)();
  }
  if (DAT_0042fa18 != (long *)0x0) {
    (**(code **)(*DAT_0042fa18 + 8))();
  }
  if (DAT_0042f870 == '\x01') {
    DAT_0042f870 = '\0';
    (*(code *)*_GeneratedCodeInfo_Annotation_default_instance_)();
  }
  if (DAT_0042fa28 != (long *)0x0) {
    (**(code **)(*DAT_0042fa28 + 8))();
  }
  if (DAT_0042f8a8 == '\x01') {
    DAT_0042f8a8 = '\0';
    (*(code *)*_GeneratedCodeInfo_default_instance_)();
  }
  if (DAT_0042fa38 != (long *)0x0) {
    (**(code **)(*DAT_0042fa38 + 8))();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _FileDescriptorSet_default_instance_.Shutdown();
  delete file_level_metadata[0].reflection;
  _FileDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[1].reflection;
  _DescriptorProto_ExtensionRange_default_instance_.Shutdown();
  delete file_level_metadata[2].reflection;
  _DescriptorProto_ReservedRange_default_instance_.Shutdown();
  delete file_level_metadata[3].reflection;
  _DescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[4].reflection;
  _FieldDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[5].reflection;
  _OneofDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[6].reflection;
  _EnumDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[7].reflection;
  _EnumValueDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[8].reflection;
  _ServiceDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[9].reflection;
  _MethodDescriptorProto_default_instance_.Shutdown();
  delete file_level_metadata[10].reflection;
  _FileOptions_default_instance_.Shutdown();
  delete file_level_metadata[11].reflection;
  _MessageOptions_default_instance_.Shutdown();
  delete file_level_metadata[12].reflection;
  _FieldOptions_default_instance_.Shutdown();
  delete file_level_metadata[13].reflection;
  _OneofOptions_default_instance_.Shutdown();
  delete file_level_metadata[14].reflection;
  _EnumOptions_default_instance_.Shutdown();
  delete file_level_metadata[15].reflection;
  _EnumValueOptions_default_instance_.Shutdown();
  delete file_level_metadata[16].reflection;
  _ServiceOptions_default_instance_.Shutdown();
  delete file_level_metadata[17].reflection;
  _MethodOptions_default_instance_.Shutdown();
  delete file_level_metadata[18].reflection;
  _UninterpretedOption_NamePart_default_instance_.Shutdown();
  delete file_level_metadata[19].reflection;
  _UninterpretedOption_default_instance_.Shutdown();
  delete file_level_metadata[20].reflection;
  _SourceCodeInfo_Location_default_instance_.Shutdown();
  delete file_level_metadata[21].reflection;
  _SourceCodeInfo_default_instance_.Shutdown();
  delete file_level_metadata[22].reflection;
  _GeneratedCodeInfo_Annotation_default_instance_.Shutdown();
  delete file_level_metadata[23].reflection;
  _GeneratedCodeInfo_default_instance_.Shutdown();
  delete file_level_metadata[24].reflection;
}